

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.h
# Opt level: O0

cmCommand * __thiscall cmSetTestsPropertiesCommand::Clone(cmSetTestsPropertiesCommand *this)

{
  cmCommand *this_00;
  cmSetTestsPropertiesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmSetTestsPropertiesCommand((cmSetTestsPropertiesCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmSetTestsPropertiesCommand;
    }